

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.cpp
# Opt level: O0

void __thiscall setup::windows_version::data::load(data *this,istream *is,version *version)

{
  byte bVar1;
  unsigned_short uVar2;
  uint uVar3;
  int_adapter<unsigned_int> *in_RDX;
  uint *in_RDI;
  
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (uVar3 < 0x1031300) {
    in_RDI[2] = 0;
  }
  else {
    uVar2 = util::load<unsigned_short>((istream *)0x18cab8);
    in_RDI[2] = (uint)uVar2;
  }
  bVar1 = util::load<unsigned_char>((istream *)0x18cade);
  in_RDI[1] = (uint)bVar1;
  bVar1 = util::load<unsigned_char>((istream *)0x18caf5);
  *in_RDI = (uint)bVar1;
  return;
}

Assistant:

void windows_version::data::load(std::istream & is, const version & version) {
	
	if(version >= INNO_VERSION(1, 3, 19)) {
		build = util::load<boost::uint16_t>(is);
	} else {
		build = 0;
	}
	
	minor = util::load<boost::uint8_t>(is);
	major = util::load<boost::uint8_t>(is);
	
}